

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O0

void fill_topten_entry(toptenentry *newtt,int how)

{
  xchar xVar1;
  __uid_t _Var2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  int uid;
  int how_local;
  toptenentry *newtt_local;
  
  _Var2 = getuid();
  newtt->death[0x54] = '\0';
  newtt->death[0x55] = '\0';
  newtt->death[0x56] = '\0';
  newtt->death[0x57] = '\0';
  newtt->death[0x58] = '\0';
  newtt->death[0x59] = '\0';
  newtt->death[0x5a] = '\0';
  newtt->death[0x5b] = '\0';
  newtt->death[0x5c] = '\0';
  newtt->death[0x5d] = '\0';
  newtt->death[0x5e] = '\0';
  newtt->death[0x5f] = '\0';
  newtt->death[0x60] = '\0';
  newtt->death[0x61] = '\0';
  newtt->death[0x62] = '\0';
  newtt->death[99] = '\0';
  newtt->death[0x44] = '\0';
  newtt->death[0x45] = '\0';
  newtt->death[0x46] = '\0';
  newtt->death[0x47] = '\0';
  newtt->death[0x48] = '\0';
  newtt->death[0x49] = '\0';
  newtt->death[0x4a] = '\0';
  newtt->death[0x4b] = '\0';
  newtt->death[0x4c] = '\0';
  newtt->death[0x4d] = '\0';
  newtt->death[0x4e] = '\0';
  newtt->death[0x4f] = '\0';
  newtt->death[0x50] = '\0';
  newtt->death[0x51] = '\0';
  newtt->death[0x52] = '\0';
  newtt->death[0x53] = '\0';
  newtt->death[0x34] = '\0';
  newtt->death[0x35] = '\0';
  newtt->death[0x36] = '\0';
  newtt->death[0x37] = '\0';
  newtt->death[0x38] = '\0';
  newtt->death[0x39] = '\0';
  newtt->death[0x3a] = '\0';
  newtt->death[0x3b] = '\0';
  newtt->death[0x3c] = '\0';
  newtt->death[0x3d] = '\0';
  newtt->death[0x3e] = '\0';
  newtt->death[0x3f] = '\0';
  newtt->death[0x40] = '\0';
  newtt->death[0x41] = '\0';
  newtt->death[0x42] = '\0';
  newtt->death[0x43] = '\0';
  newtt->death[0x24] = '\0';
  newtt->death[0x25] = '\0';
  newtt->death[0x26] = '\0';
  newtt->death[0x27] = '\0';
  newtt->death[0x28] = '\0';
  newtt->death[0x29] = '\0';
  newtt->death[0x2a] = '\0';
  newtt->death[0x2b] = '\0';
  newtt->death[0x2c] = '\0';
  newtt->death[0x2d] = '\0';
  newtt->death[0x2e] = '\0';
  newtt->death[0x2f] = '\0';
  newtt->death[0x30] = '\0';
  newtt->death[0x31] = '\0';
  newtt->death[0x32] = '\0';
  newtt->death[0x33] = '\0';
  newtt->death[0x14] = '\0';
  newtt->death[0x15] = '\0';
  newtt->death[0x16] = '\0';
  newtt->death[0x17] = '\0';
  newtt->death[0x18] = '\0';
  newtt->death[0x19] = '\0';
  newtt->death[0x1a] = '\0';
  newtt->death[0x1b] = '\0';
  newtt->death[0x1c] = '\0';
  newtt->death[0x1d] = '\0';
  newtt->death[0x1e] = '\0';
  newtt->death[0x1f] = '\0';
  newtt->death[0x20] = '\0';
  newtt->death[0x21] = '\0';
  newtt->death[0x22] = '\0';
  newtt->death[0x23] = '\0';
  newtt->death[4] = '\0';
  newtt->death[5] = '\0';
  newtt->death[6] = '\0';
  newtt->death[7] = '\0';
  newtt->death[8] = '\0';
  newtt->death[9] = '\0';
  newtt->death[10] = '\0';
  newtt->death[0xb] = '\0';
  newtt->death[0xc] = '\0';
  newtt->death[0xd] = '\0';
  newtt->death[0xe] = '\0';
  newtt->death[0xf] = '\0';
  newtt->death[0x10] = '\0';
  newtt->death[0x11] = '\0';
  newtt->death[0x12] = '\0';
  newtt->death[0x13] = '\0';
  newtt->name[4] = '\0';
  newtt->name[5] = '\0';
  newtt->name[6] = '\0';
  newtt->name[7] = '\0';
  newtt->name[8] = '\0';
  newtt->name[9] = '\0';
  newtt->name[10] = '\0';
  newtt->name[0xb] = '\0';
  *(undefined8 *)(newtt->name + 0xc) = 0;
  newtt->plrace[0] = '\0';
  newtt->plrace[1] = '\0';
  newtt->plrace[2] = '\0';
  newtt->plrace[3] = '\0';
  newtt->plgend[0] = '\0';
  newtt->plgend[1] = '\0';
  newtt->plgend[2] = '\0';
  newtt->plgend[3] = '\0';
  newtt->plalign[0] = '\0';
  newtt->plalign[1] = '\0';
  newtt->plalign[2] = '\0';
  newtt->plalign[3] = '\0';
  newtt->name[0] = '\0';
  newtt->name[1] = '\0';
  newtt->name[2] = '\0';
  newtt->name[3] = '\0';
  newtt->uid = 0;
  newtt->moves = 0;
  newtt->how = 0;
  newtt->plrole[0] = '\0';
  newtt->plrole[1] = '\0';
  newtt->plrole[2] = '\0';
  newtt->plrole[3] = '\0';
  newtt->ver_minor = 0;
  newtt->patchlevel = 0;
  newtt->deathdate = 0;
  newtt->birthdate = 0;
  newtt->hp = 0;
  newtt->maxhp = 0;
  newtt->deaths = 0;
  newtt->ver_major = 0;
  newtt->points = 0;
  newtt->deathdnum = 0;
  newtt->deathlev = 0;
  newtt->maxlvl = 0;
  newtt->ver_major = 0;
  newtt->ver_minor = 0;
  newtt->patchlevel = 1;
  newtt->points = u.urscore;
  newtt->deathdnum = (int)u.uz.dnum;
  iVar3 = observable_depth(&u.uz);
  newtt->deathlev = iVar3;
  xVar1 = deepest_lev_reached('\x01');
  newtt->maxlvl = (int)xVar1;
  newtt->hp = u.uhp;
  newtt->maxhp = u.uhpmax;
  newtt->deaths = u.umortality;
  newtt->uid = _Var2;
  newtt->moves = moves;
  newtt->how = how;
  strncpy(newtt->plrole,urole.filecode,3);
  newtt->plrole[3] = '\0';
  strncpy(newtt->plrace,urace.filecode,3);
  newtt->plrace[3] = '\0';
  strncpy(newtt->plgend,genders[flags.female].filecode,3);
  newtt->plgend[3] = '\0';
  strncpy(newtt->plalign,aligns[1 - u.ualign.type].filecode,3);
  newtt->plalign[3] = '\0';
  strncpy(newtt->name,plname,0xf);
  newtt->name[0xf] = '\0';
  newtt->death[0] = '\0';
  if (killer_format != 0) {
    if (killer_format == 1) {
      strcat(newtt->death,killed_by_prefix[how]);
      pcVar4 = killer;
      sVar5 = strlen(newtt->death);
      strncat(newtt->death,pcVar4,99 - sVar5);
      goto LAB_0030142c;
    }
    if (killer_format == 2) {
      strncat(newtt->death,killer,99);
      goto LAB_0030142c;
    }
    warning("bad killer format?");
  }
  strcat(newtt->death,killed_by_prefix[how]);
  pcVar4 = an(killer);
  sVar5 = strlen(newtt->death);
  strncat(newtt->death,pcVar4,99 - sVar5);
LAB_0030142c:
  lVar6 = yyyymmdd(u.ubirthday);
  newtt->birthdate = (int)lVar6;
  lVar6 = yyyymmdd(0);
  newtt->deathdate = (int)lVar6;
  time(&deathtime_internal);
  return;
}

Assistant:

static void fill_topten_entry(struct toptenentry *newtt, int how)
{
    int uid = getuid();
    memset(newtt, 0, sizeof(struct toptenentry));
    
    /* deepest_lev_reached() is in terms of depth(), and reporting the
     * deepest level reached in the dungeon death occurred in doesn't
     * seem right, so we have to report the death level in depth() terms
     * as well (which also seems reasonable since that's all the player
     * sees on the screen anyway)
     */
    newtt->ver_major = VERSION_MAJOR;
    newtt->ver_minor = VERSION_MINOR;
    newtt->patchlevel = PATCHLEVEL;
    newtt->points = u.urscore;
    newtt->deathdnum = u.uz.dnum;
    newtt->deathlev = observable_depth(&u.uz);
    newtt->maxlvl = deepest_lev_reached(TRUE);
    newtt->hp = u.uhp;
    newtt->maxhp = u.uhpmax;
    newtt->deaths = u.umortality;
    newtt->uid = uid;
    newtt->moves = moves;
    newtt->how = how;
    strncpy(newtt->plrole, urole.filecode, ROLESZ);
    newtt->plrole[ROLESZ] = '\0';
    strncpy(newtt->plrace, urace.filecode, ROLESZ);
    newtt->plrace[ROLESZ] = '\0';
    strncpy(newtt->plgend, genders[flags.female].filecode, ROLESZ);
    newtt->plgend[ROLESZ] = '\0';
    strncpy(newtt->plalign, aligns[1-u.ualign.type].filecode, ROLESZ);
    newtt->plalign[ROLESZ] = '\0';
    strncpy(newtt->name, plname, NAMSZ);
    newtt->name[NAMSZ] = '\0';
    newtt->death[0] = '\0';
    switch (killer_format) {
	default: warning("bad killer format?");
	case KILLED_BY_AN:
	    strcat(newtt->death, killed_by_prefix[how]);
	    strncat(newtt->death, an(killer),
				    DTHSZ-strlen(newtt->death));
	    break;
	case KILLED_BY:
	    strcat(newtt->death, killed_by_prefix[how]);
	    strncat(newtt->death, killer, DTHSZ-strlen(newtt->death));
	    break;
	case NO_KILLER_PREFIX:
	    strncat(newtt->death, killer, DTHSZ);
	    break;
    }
    newtt->birthdate = yyyymmdd(u.ubirthday);
    newtt->deathdate = yyyymmdd((time_t)0L);
    time(&deathtime_internal);
}